

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdiSubWindowPrivate::setNormalMode(QMdiSubWindowPrivate *this)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  QMdiSubWindowPrivate *this_00;
  QMdiSubWindowPrivate *in_RDI;
  long in_FS_OFFSET;
  bool in_stack_0000001e;
  bool wasVisible;
  QMdiSubWindow *q;
  QRect newGeometry;
  undefined8 in_stack_ffffffffffffffa8;
  QSize *pQVar4;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 uVar6;
  undefined7 in_stack_ffffffffffffffc0;
  QMdiSubWindowPrivate *this_01;
  QMdiSubWindowPrivate *in_stack_ffffffffffffffd8;
  QRect *r;
  QWidget *this_02;
  QSize local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = (QMdiSubWindowPrivate *)q_func(in_RDI);
  in_RDI->isShadeMode = false;
  in_RDI->isMaximizeMode = false;
  ensureWindowState(in_stack_ffffffffffffffd8,(WindowState)((ulong)this_01 >> 0x20));
  removeButtonsFromMenuBar(this_01);
  bVar2 = QWidget::isVisible((QWidget *)0x630ccd);
  if ((bool)bVar2) {
    (**(code **)(*(long *)&this_00->super_QWidgetPrivate + 0x68))(this_00,0);
  }
  bVar3 = QSize::isNull((QSize *)CONCAT17(bVar2,in_stack_ffffffffffffffc0));
  if (!bVar3) {
    QWidget::setMinimumSize((QWidget *)CONCAT17(bVar2,in_stack_ffffffffffffffc0),(QSize *)in_RDI);
    QSize::QSize((QSize *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(int)in_stack_ffffffffffffffa8);
    in_RDI->userMinimumSize = local_10;
  }
  bVar3 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x630d42);
  if ((bVar3) && ((in_RDI->isWidgetHiddenByUs & 1U) != 0)) {
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x630d67);
    QWidget::show((QWidget *)CONCAT17(bVar2,in_stack_ffffffffffffffc0));
    in_RDI->isWidgetHiddenByUs = false;
  }
  updateGeometryConstraints(this_00);
  r = *(QRect **)&in_RDI->oldGeometry;
  this_02 = *(QWidget **)&(in_RDI->oldGeometry).x2;
  QSize::expandedTo((QSize *)in_RDI,
                    (QSize *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  QRect::setSize((QRect *)this_00,(QSize *)CONCAT17(bVar2,in_stack_ffffffffffffffc0));
  QWidget::setGeometry(this_02,r);
  if ((bVar2 & 1) != 0) {
    (**(code **)(*(long *)&this_00->super_QWidgetPrivate + 0x68))(this_00,1);
  }
  pQVar4 = &in_RDI->restoreSize;
  uVar5 = 0xffffffff;
  QSize::setWidth((QSize *)CONCAT44(in_stack_ffffffffffffffb4,0xffffffff),
                  (int)((ulong)pQVar4 >> 0x20));
  QSize::setHeight((QSize *)CONCAT44(in_stack_ffffffffffffffb4,uVar5),(int)((ulong)pQVar4 >> 0x20));
  uVar6 = 1;
  setSizeGripVisible((QMdiSubWindowPrivate *)CONCAT17(bVar2,in_stack_ffffffffffffffc0),
                     SUB81((ulong)in_RDI >> 0x38,0));
  setEnabled((QMdiSubWindowPrivate *)CONCAT44(uVar6,uVar5),
             (WindowStateAction)((ulong)pQVar4 >> 0x20),SUB81((ulong)pQVar4 >> 0x18,0));
  setEnabled((QMdiSubWindowPrivate *)CONCAT44(uVar6,uVar5),
             (WindowStateAction)((ulong)pQVar4 >> 0x20),SUB81((ulong)pQVar4 >> 0x18,0));
  setEnabled((QMdiSubWindowPrivate *)CONCAT44(uVar6,uVar5),
             (WindowStateAction)((ulong)pQVar4 >> 0x20),SUB81((ulong)pQVar4 >> 0x18,0));
  setEnabled((QMdiSubWindowPrivate *)CONCAT44(uVar6,uVar5),
             (WindowStateAction)((ulong)pQVar4 >> 0x20),SUB81((ulong)pQVar4 >> 0x18,0));
  setEnabled((QMdiSubWindowPrivate *)CONCAT44(uVar6,uVar5),
             (WindowStateAction)((ulong)pQVar4 >> 0x20),SUB81((ulong)pQVar4 >> 0x18,0));
  setActive((QMdiSubWindowPrivate *)q,wasVisible,in_stack_0000001e);
  restoreFocus(in_RDI);
  updateMask(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiSubWindowPrivate::setNormalMode()
{
    Q_Q(QMdiSubWindow);
    Q_ASSERT(parent);

    isShadeMode = false;
    isMaximizeMode = false;

    ensureWindowState(Qt::WindowNoState);
#if QT_CONFIG(menubar)
    removeButtonsFromMenuBar();
#endif

    // Hide the window before we change the geometry to avoid multiple resize
    // events and wrong window state.
    const bool wasVisible = q->isVisible();
    if (wasVisible)
        q->setVisible(false);

    // Restore minimum size if set by user.
    if (!userMinimumSize.isNull()) {
        q->setMinimumSize(userMinimumSize);
        userMinimumSize = QSize(0, 0);
    }

    // Show the internal widget if it was hidden by us,
    if (baseWidget && isWidgetHiddenByUs) {
        baseWidget->show();
        isWidgetHiddenByUs = false;
    }

    updateGeometryConstraints();
    QRect newGeometry = oldGeometry;
    newGeometry.setSize(restoreSize.expandedTo(internalMinimumSize));
    q->setGeometry(newGeometry);

    if (wasVisible)
        q->setVisible(true);

    // Invalidate the restore size.
    restoreSize.setWidth(-1);
    restoreSize.setHeight(-1);

#if QT_CONFIG(sizegrip)
    setSizeGripVisible(true);
#endif

#ifndef QT_NO_ACTION
    setEnabled(MoveAction, true);
    setEnabled(MaximizeAction, true);
    setEnabled(MinimizeAction, true);
    setEnabled(RestoreAction, false);
    setEnabled(ResizeAction, resizeEnabled);
#endif // QT_NO_ACTION

    Q_ASSERT(!(q_func()->windowState() & Qt::WindowMinimized));
    // This sub-window can be maximized when shown above if not the
    // QMdiArea::DontMaximizeSubWindowOnActionvation is set. Make sure
    // the Qt::WindowMaximized flag is set accordingly.
    Q_ASSERT((isMaximizeMode && q_func()->windowState() & Qt::WindowMaximized)
             || (!isMaximizeMode && !(q_func()->windowState() & Qt::WindowMaximized)));
    Q_ASSERT(!isShadeMode);

    setActive(true);
    restoreFocus();
    updateMask();
}